

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::LoadUSDCLayerFromMemory
               (uint8_t *addr,size_t length,string *filename,Layer *layer,string *warn,string *err,
               USDLoadOptions *options)

{
  bool bVar1;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  undefined4 local_1e4;
  string local_1e0;
  string local_1c0;
  USDCReader local_1a0;
  USDCReader reader;
  USDCReaderConfig config;
  StreamReader sr;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong local_50;
  size_t max_length;
  string *psStack_40;
  bool swap_endian;
  string *err_local;
  string *warn_local;
  Layer *layer_local;
  string *filename_local;
  size_t length_local;
  uint8_t *addr_local;
  
  psStack_40 = err;
  err_local = warn;
  warn_local = &layer->_name;
  layer_local = (Layer *)filename;
  filename_local = (string *)length;
  length_local = (size_t)addr;
  if (layer == (Layer *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator=((string *)err,"null pointer for `layer` argument.\n");
    }
    addr_local._7_1_ = 0;
  }
  else {
    max_length._7_1_ = 0;
    local_50 = (long)options->max_memory_limit_in_mb << 0x14;
    if (local_50 < length) {
      if (err != (string *)0x0) {
        ::std::operator+((char *)&local_110,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "USDC data [");
        ::std::operator+(&local_f0,&local_110,"] is too large(size = ");
        ::std::__cxx11::to_string(&local_130,(unsigned_long)filename_local);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_f0);
        ::std::operator+(&local_b0,&local_d0,", which exceeds memory limit ");
        ::std::__cxx11::to_string((string *)&sr.idx_,local_50);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_90,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_b0);
        ::std::operator+(&local_70,&local_90,".\n");
        ::std::__cxx11::string::operator+=((string *)psStack_40,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&sr.idx_);
        ::std::__cxx11::string::~string((string *)&local_b0);
        ::std::__cxx11::string::~string((string *)&local_d0);
        ::std::__cxx11::string::~string((string *)&local_130);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::__cxx11::string::~string((string *)&local_110);
      }
      addr_local._7_1_ = 0;
    }
    else {
      StreamReader::StreamReader((StreamReader *)&config.allow_unknown_prims,addr,length,false);
      usdc::USDCReaderConfig::USDCReaderConfig((USDCReaderConfig *)&reader);
      reader.impl_._0_4_ = options->num_threads;
      config.kMaxAllowedMemoryInMB._2_1_ = options->strict_allowedToken_check & 1;
      config.kMaxAllowedMemoryInMB._1_1_ = (options->strict_apiSchema_check ^ 0xffU) & 1;
      usdc::USDCReader::USDCReader
                (&local_1a0,(StreamReader *)&config.allow_unknown_prims,(USDCReaderConfig *)&reader)
      ;
      bVar1 = usdc::USDCReader::ReadUSDC(&local_1a0);
      if (bVar1) {
        bVar1 = usdc::USDCReader::get_as_layer(&local_1a0,(Layer *)warn_local);
        if (bVar1) {
          if (err_local != (string *)0x0) {
            usdc::USDCReader::GetWarning_abi_cxx11_(&local_248,&local_1a0);
            ::std::__cxx11::string::operator=((string *)err_local,(string *)&local_248);
            ::std::__cxx11::string::~string((string *)&local_248);
          }
          if (psStack_40 != (string *)0x0) {
            usdc::USDCReader::GetError_abi_cxx11_(&local_268,&local_1a0);
            ::std::__cxx11::string::operator=((string *)psStack_40,(string *)&local_268);
            ::std::__cxx11::string::~string((string *)&local_268);
          }
          addr_local._7_1_ = 1;
        }
        else {
          if (err_local != (string *)0x0) {
            usdc::USDCReader::GetWarning_abi_cxx11_(&local_208,&local_1a0);
            ::std::__cxx11::string::operator=((string *)err_local,(string *)&local_208);
            ::std::__cxx11::string::~string((string *)&local_208);
          }
          if (psStack_40 != (string *)0x0) {
            usdc::USDCReader::GetError_abi_cxx11_(&local_228,&local_1a0);
            ::std::__cxx11::string::operator=((string *)psStack_40,(string *)&local_228);
            ::std::__cxx11::string::~string((string *)&local_228);
          }
          addr_local._7_1_ = 0;
        }
      }
      else {
        if (err_local != (string *)0x0) {
          usdc::USDCReader::GetWarning_abi_cxx11_(&local_1c0,&local_1a0);
          ::std::__cxx11::string::operator=((string *)err_local,(string *)&local_1c0);
          ::std::__cxx11::string::~string((string *)&local_1c0);
        }
        if (psStack_40 != (string *)0x0) {
          usdc::USDCReader::GetError_abi_cxx11_(&local_1e0,&local_1a0);
          ::std::__cxx11::string::operator=((string *)psStack_40,(string *)&local_1e0);
          ::std::__cxx11::string::~string((string *)&local_1e0);
        }
        addr_local._7_1_ = 0;
      }
      local_1e4 = 1;
      usdc::USDCReader::~USDCReader(&local_1a0);
    }
  }
  return (bool)(addr_local._7_1_ & 1);
}

Assistant:

bool LoadUSDCLayerFromMemory(const uint8_t *addr, const size_t length,
                        const std::string &filename, Layer *layer,
                        std::string *warn, std::string *err,
                        const USDLoadOptions &options) {
  if (layer == nullptr) {
    if (err) {
      (*err) = "null pointer for `layer` argument.\n";
    }
    return false;
  }

  bool swap_endian = false;  // @FIXME

  size_t max_length;

  // 32bit env
  if (sizeof(void *) == 4) {
    if (options.max_memory_limit_in_mb > 4096) {  // exceeds 4GB
      max_length = std::numeric_limits<uint32_t>::max();
    } else {
      max_length =
          size_t(1024) * size_t(1024) * size_t(options.max_memory_limit_in_mb);
    }
  } else {
    // TODO: Set hard limit?
    max_length =
        size_t(1024) * size_t(1024) * size_t(options.max_memory_limit_in_mb);
  }

  DCOUT("Max length = " << max_length);

  if (length > max_length) {
    if (err) {
      (*err) += "USDC data [" + filename +
                "] is too large(size = " + std::to_string(length) +
                ", which exceeds memory limit " + std::to_string(max_length) +
                ".\n";
    }

    return false;
  }

  StreamReader sr(addr, length, swap_endian);

  usdc::USDCReaderConfig config;
  config.numThreads = options.num_threads;
  config.strict_allowedToken_check = options.strict_allowedToken_check;
  config.allow_unknown_apiSchemas = !options.strict_apiSchema_check;
  usdc::USDCReader reader(&sr, config);

  if (!reader.ReadUSDC()) {
    if (warn) {
      (*warn) = reader.GetWarning();
    }

    if (err) {
      (*err) = reader.GetError();
    }
    return false;
  }

  DCOUT("Loaded USDC file.");

  {
    if (!reader.get_as_layer(layer)) {
      DCOUT("Failed to reconstruct Layer from Crate.");
      if (warn) {
        (*warn) = reader.GetWarning();
      }

      if (err) {
        (*err) = reader.GetError();
      }
      return false;
    }
  }

  if (warn) {
    (*warn) = reader.GetWarning();
  }

  // Reconstruct OK but may have some error.
  // TODO(syoyo): Return false in strict mode.
  if (err) {
    DCOUT(reader.GetError());
    (*err) = reader.GetError();
  }

  DCOUT("Reconstructed Stage from USDC file.");

  return true;
}